

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GPUShaderFP64Test5::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test5 *this,_test_case *test_case)

{
  _test_case_type _Var1;
  _variable_type _Var2;
  uint uVar3;
  uint uVar4;
  GPUShaderFP64Test5 *pGVar5;
  ostream *poVar6;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  uint swizzle_n_components;
  string src_type_string;
  string dst_type_string;
  string swizzle_string;
  string base_type_string;
  uint swizzle_component_order [4];
  stringstream result;
  uint local_264;
  string *local_260;
  string local_258;
  string local_238;
  ulong local_218;
  GPUShaderFP64Test5 *local_210;
  string local_208;
  string local_1e8;
  uint local_1c8 [4];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_260 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  _Var2 = Utils::getBaseVariableType(test_case->src_type);
  Utils::getVariableTypeString_abi_cxx11_(&local_1e8,(Utils *)(ulong)_Var2,type);
  Utils::getVariableTypeString_abi_cxx11_(&local_238,(Utils *)(ulong)test_case->dst_type,type_00);
  uVar3 = Utils::getNumberOfComponentsForVariableType(test_case->dst_type);
  uVar4 = Utils::getNumberOfComponentsForVariableType(test_case->src_type);
  local_218 = (ulong)uVar3;
  local_210 = this;
  Utils::getVariableTypeString_abi_cxx11_(&local_258,(Utils *)(ulong)test_case->src_type,type_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 420\n\n",0xe);
  if (test_case->dst_type == VARIABLE_TYPE_BOOL) {
    lVar7 = 0x10;
    pcVar8 = "out int result;\n";
    pGVar5 = (GPUShaderFP64Test5 *)local_1a8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    pGVar5 = (GPUShaderFP64Test5 *)
             std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
    lVar7 = 9;
    pcVar8 = " result;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pGVar5,pcVar8,lVar7);
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    lVar7 = 0x13;
    pcVar8 = "in int base_value;\n";
    pGVar5 = (GPUShaderFP64Test5 *)local_1a8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    pGVar5 = (GPUShaderFP64Test5 *)
             std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    lVar7 = 0xd;
    pcVar8 = " base_value;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pGVar5,pcVar8,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n{\n",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," lside_value = ",0xf);
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    lVar7 = 6;
    pcVar8 = "(0 != ";
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    lVar7 = 1;
    pcVar8 = "(";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"base_value",10);
  }
  else {
    uVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"base_value + ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      if (uVar4 - 1 != uVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  _Var1 = test_case->type;
  pGVar5 = (GPUShaderFP64Test5 *)local_1a8;
  if (test_case->dst_type == VARIABLE_TYPE_BOOL) {
    pcVar8 = "result = (lside_value == false) ? 0 : 1";
    if (_Var1 == TEST_CASE_TYPE_EXPLICIT) {
      pcVar8 = "result = (bool(lside_value) == false) ? 0 : 1";
    }
    lVar7 = 0x27;
    if (_Var1 == TEST_CASE_TYPE_EXPLICIT) {
      lVar7 = 0x2d;
    }
  }
  else if (_Var1 == TEST_CASE_TYPE_EXPLICIT) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"result = ",9);
    pGVar5 = (GPUShaderFP64Test5 *)
             std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
    lVar7 = 0xd;
    pcVar8 = "(lside_value)";
  }
  else {
    lVar7 = 0x14;
    pcVar8 = "result = lside_value";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pGVar5,pcVar8,lVar7);
  if ((1 < uVar4) &&
     ((VARIABLE_TYPE_MAT4X3 < test_case->src_type ||
      ((0x7fc03fe0U >> (test_case->src_type & VARIABLE_TYPE_UINT) & 1) == 0)))) {
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    local_1c8[2] = 0;
    local_1c8[3] = 0;
    local_264 = 0;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    getSwizzleTypeProperties
              (pGVar5,local_210->m_swizzle_matrix[(int)local_218 - 1][uVar4 - 1],&local_208,
               &local_264,local_1c8);
    if (local_264 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n}\n",4);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_260;
}

Assistant:

std::string GPUShaderFP64Test5::getVertexShaderBody(const _test_case& test_case)
{
	std::stringstream  result;
	const std::string  base_type_string = Utils::getVariableTypeString(Utils::getBaseVariableType(test_case.src_type));
	const std::string  dst_type_string  = Utils::getVariableTypeString(test_case.dst_type);
	const unsigned int n_dst_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int n_src_components = Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	const std::string  src_type_string  = Utils::getVariableTypeString(test_case.src_type);

	/* Add version preamble */
	result << "#version 420\n"
			  "\n";

	/* Declare output variables. Note that boolean output variables are not supported, so we need
	 * to handle that special case correctly */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << "out int result;\n";
	}
	else
	{
		result << "out " << dst_type_string << " result;\n";
	}

	/* Declare input variables. Handle the bool case exclusively. */
	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Use ints for bools. We will cast them to bool in the code later. */
		result << "in int base_value;\n";
	}
	else
	{
		result << "in " << base_type_string << " base_value;\n";
	}

	/* Declare main() and construct the value we will be casting from.
	 *
	 * Note: Addition operations on bool values cause an implicit conversion to int
	 *       which is not allowed. Hence, we skip these operations for this special
	 *       case.
	 */
	result << "void main()\n"
			  "{\n"
		   << src_type_string << " lside_value = ";

	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << src_type_string << "(0 != ";
	}
	else
	{
		result << src_type_string << "(";
	}

	if (test_case.src_type != Utils::VARIABLE_TYPE_BOOL)
	{
		for (unsigned int n_component = 0; n_component < n_src_components; ++n_component)
		{
			result << "base_value + " << n_component;

			if (n_component != (n_src_components - 1))
			{
				result << ", ";
			}
		} /* for (all components) */
	}
	else
	{
		DE_ASSERT(n_src_components == 1);

		result << "base_value";
	}

	result << ");\n";

	/* Perform the casting operation. Add swizzle operator if possible. */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Handle the bool case exclusively */
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = (bool(lside_value) == false) ? 0 : 1";
		}
		else
		{
			result << "result = (lside_value == false) ? 0 : 1";
		}
	}
	else
	{
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = " << dst_type_string << "(lside_value)";
		}
		else
		{
			result << "result = lside_value";
		}
	}

	if (n_src_components > 1 && !Utils::isMatrixVariableType(test_case.src_type))
	{
		/* Add a swizzle operator  */
		DE_ASSERT(n_dst_components > 0 && n_dst_components <= 4);
		DE_ASSERT(n_src_components > 0 && n_src_components <= 4);

		unsigned int  swizzle_component_order[4] = { 0 };
		unsigned int  swizzle_n_components		 = 0;
		_swizzle_type swizzle_operator			 = m_swizzle_matrix[n_dst_components - 1][n_src_components - 1];
		std::string   swizzle_string;

		getSwizzleTypeProperties(swizzle_operator, &swizzle_string, &swizzle_n_components, swizzle_component_order);

		if (swizzle_n_components > 0)
		{
			result << "." << swizzle_string;
		}
	}

	/* Close the shader implementation. */
	result << ";\n"
			  "}\n";

	return result.str();
}